

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,_testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,_bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,_testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderTestDelegate>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  const_iterator cVar11;
  CodeLocation *pCVar12;
  long *plVar13;
  size_t sVar14;
  TestFactoryBase *pTVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 extraout_RAX_00;
  internal *piVar16;
  ulong *puVar17;
  long *plVar18;
  size_type *psVar19;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *extraout_RDX_05;
  type_info *extraout_RDX_06;
  type_info *extraout_RDX_07;
  type_info *extraout_RDX_08;
  type_info *extraout_RDX_09;
  type_info *extraout_RDX_10;
  type_info *extraout_RDX_11;
  type_info *extraout_RDX_12;
  type_info *extraout_RDX_13;
  type_info *extraout_RDX_14;
  type_info *ptVar20;
  ulong uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  char *pcVar23;
  char *pcVar24;
  CodeLocation *pCVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  _Alloc_hider _Var27;
  string test_name;
  string test_name_1;
  string test_name_2;
  string test_name_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b8;
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  GTestLog local_394;
  string local_390;
  int local_370;
  string local_368;
  CodeLocation local_348;
  string local_320;
  internal *local_300;
  long local_2f8;
  undefined8 local_2f0;
  long lStack_2e8;
  uint local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  long local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  int local_2b8;
  string local_2b0;
  internal *local_290;
  long local_288;
  internal local_280;
  undefined6 uStack_27f;
  undefined4 uStack_279;
  undefined1 uStack_275;
  undefined4 uStack_274;
  uint local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  CodeLocation *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  long local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  int local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  TypedTestSuitePState *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  int local_1d0;
  string local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  long local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  int local_188;
  internal *local_180;
  long local_178;
  ulong local_170;
  undefined8 uStack_168;
  uint local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  CodeLocation *local_118;
  size_type local_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  key_type local_d0;
  key_type local_b0;
  undefined1 local_90 [17];
  undefined7 uStack_7f;
  undefined8 uStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_1f8 = state;
  RegisterTypeParameterizedTestSuiteInstantiation("VerifyCertificateChainSingleRootTest");
  pcVar10 = strchr((char *)code_location,0x2c);
  if (pcVar10 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,(char *)code_location,(allocator<char> *)&local_348);
  }
  else {
    local_158 = &local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,code_location,pcVar10);
  }
  local_d0._M_dataplus._M_p = (pointer)local_158;
  local_248 = code_location;
  if (local_150 != 0) {
    pcVar10 = local_158->_M_local_buf + local_150;
    do {
      paVar26 = local_158;
      iVar9 = isspace((uint)(byte)pcVar10[-1]);
      local_d0._M_dataplus._M_p = (pointer)paVar26;
      if (iVar9 == 0) break;
      pcVar23 = pcVar10 + -1;
      uVar21 = (long)pcVar23 - (long)paVar26;
      std::__cxx11::string::_M_erase((ulong)&local_158,uVar21);
      pcVar10 = local_158->_M_local_buf + uVar21;
      local_d0._M_dataplus._M_p = (pointer)local_158;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar23 != paVar26);
  }
  local_158 = &local_148;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == local_158) {
    local_d0.field_2._8_8_ = local_148._8_8_;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  local_d0.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_d0.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_d0._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                   *)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 8
                     ),&local_d0);
  iVar9 = 0x6e1c18;
  if (cVar11._M_node ==
      (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 0x10)
     ) {
    FormatFileLocation_abi_cxx11_
              (&local_348.file,*(internal **)prefix,(char *)(ulong)*(uint *)(prefix + 0x20),0x6e1c18
              );
    TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderTestDelegate>>
    ::Register();
LAB_0039f197:
    FormatFileLocation_abi_cxx11_(&local_348.file,local_180,(char *)(ulong)local_160,iVar9);
    TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderTestDelegate>>
    ::Register();
  }
  else {
    pCVar12 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_,
                         &local_d0);
    local_1a8 = &local_198;
    pcVar2 = (pCVar12->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar2,pcVar2 + (pCVar12->file)._M_string_length);
    local_188 = pCVar12->line;
    local_290 = &local_280;
    local_280 = (internal)0x50;
    uStack_27f = 0x697542687461;
    uStack_279 = 0x7265646c;
    local_288 = 0xb;
    uStack_275 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_290);
    pCVar12 = local_248;
    local_240 = &local_230;
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar26) {
      local_230._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_230._8_8_ = plVar13[3];
    }
    else {
      local_230._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13;
    }
    local_238 = plVar13[1];
    *plVar13 = (long)paVar26;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_240);
    local_300 = (internal *)&local_2f0;
    piVar16 = (internal *)(plVar13 + 2);
    if ((internal *)*plVar13 == piVar16) {
      local_2f0 = *(long *)piVar16;
      lStack_2e8 = plVar13[3];
    }
    else {
      local_2f0 = *(long *)piVar16;
      local_300 = (internal *)*plVar13;
    }
    local_2f8 = plVar13[1];
    *plVar13 = (long)piVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_2d8 = &local_2c8;
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar26) {
      local_2c8._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_2c8._8_8_ = plVar13[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13;
    }
    local_2d0 = plVar13[1];
    *plVar13 = (long)paVar26;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_2d8,**(ulong **)local_1f8);
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    puVar17 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_390.field_2._M_allocated_capacity = *puVar17;
      local_390.field_2._8_8_ = plVar13[3];
    }
    else {
      local_390.field_2._M_allocated_capacity = *puVar17;
      local_390._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_390._M_string_length = plVar13[1];
    *plVar13 = (long)puVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    pcVar10 = strchr((char *)pCVar12,0x2c);
    if (pcVar10 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,(char *)pCVar12,(allocator<char> *)&local_368);
      ptVar20 = extraout_RDX_00;
    }
    else {
      local_3b8 = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,pCVar12,pcVar10);
      ptVar20 = extraout_RDX;
    }
    paVar26 = local_3b8;
    if (local_3b0 != 0) {
      pcVar10 = local_3b8->_M_local_buf + local_3b0;
      do {
        paVar22 = local_3b8;
        iVar9 = isspace((uint)(byte)pcVar10[-1]);
        ptVar20 = extraout_RDX_01;
        paVar26 = paVar22;
        if (iVar9 == 0) break;
        pcVar23 = pcVar10 + -1;
        uVar21 = (long)pcVar23 - (long)paVar22;
        std::__cxx11::string::_M_erase((ulong)&local_3b8,uVar21);
        pcVar10 = local_3b8->_M_local_buf + uVar21;
        ptVar20 = extraout_RDX_02;
        paVar26 = local_3b8;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar23 != paVar22);
    }
    uVar7 = local_320.field_2._7_4_;
    paVar22 = &local_320.field_2;
    local_3b8 = &local_3a8;
    local_320.field_2._M_local_buf[7] = (char)((ulong)local_3a8._0_8_ >> 0x38);
    local_320.field_2._M_allocated_capacity._0_7_ = (undefined7)local_3a8._M_allocated_capacity;
    if (paVar26 == local_3b8) {
      local_320.field_2._8_3_ = (undefined3)local_3a8._8_8_;
      local_320.field_2._M_local_buf[0xb] = (char)((ulong)local_3a8._8_8_ >> 0x18);
      local_320.field_2._12_4_ = (undefined4)((ulong)local_3a8._8_8_ >> 0x20);
    }
    else {
      local_320.field_2._8_3_ = SUB43(uVar7,1);
      paVar22 = paVar26;
    }
    local_320._M_string_length = local_3b0;
    local_3b0 = 0;
    local_3a8._M_allocated_capacity = local_3a8._M_allocated_capacity & 0xffffffffffffff00;
    local_320._M_dataplus._M_p = (pointer)paVar22;
    GetTypeName_abi_cxx11_
              (&local_368,
               (internal *)&bssl::(anonymous_namespace)::PathBuilderTestDelegate::typeinfo,ptVar20);
    _Var27._M_p = local_368._M_dataplus._M_p;
    local_348.file._M_dataplus._M_p = (pointer)&local_348.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_1a8,local_1a0 + (long)local_1a8);
    iVar9 = local_188;
    paVar26 = local_1a8;
    local_348.line = local_188;
    bVar8 = IsTrue(true);
    if (!bVar8) {
      GTestLog::GTestLog((GTestLog *)&local_2b0,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar26 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar14 = strlen(paVar26->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar26->_M_local_buf,sVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar9);
      GTestLog::~GTestLog((GTestLog *)&local_2b0);
    }
    iVar9 = local_188;
    paVar26 = local_1a8;
    bVar8 = IsTrue(true);
    if (!bVar8) {
      GTestLog::GTestLog((GTestLog *)&local_2b0,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar26 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar14 = strlen(paVar26->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar26->_M_local_buf,sVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar9);
      GTestLog::~GTestLog((GTestLog *)&local_2b0);
    }
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006c4278;
    MakeAndRegisterTestInfo
              (&local_390,paVar22->_M_local_buf,_Var27._M_p,(char *)0x0,&local_348,
               &TypeIdHelper<bssl::VerifyCertificateChainSingleRootTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.file._M_dataplus._M_p != &local_348.file.field_2) {
      operator_delete(local_348.file._M_dataplus._M_p,
                      local_348.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,
                      CONCAT17(local_368.field_2._M_local_buf[7],
                               CONCAT61(local_368.field_2._M_allocated_capacity._1_6_,
                                        local_368.field_2._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      CONCAT17(local_320.field_2._M_local_buf[7],
                               local_320.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,local_3a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if (local_300 != (internal *)&local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230._M_allocated_capacity + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,CONCAT17((undefined1)uStack_279,CONCAT61(uStack_27f,local_280)) + 1)
      ;
    }
    if (local_1a8 == &local_198) {
      local_1e0._8_8_ = local_198._8_8_;
      local_1a8 = &local_1e0;
    }
    local_1e0._M_allocated_capacity._1_7_ = local_198._M_allocated_capacity._1_7_;
    local_1e0._M_local_buf[0] = local_198._M_local_buf[0];
    local_1e8 = local_1a0;
    local_1a0 = 0;
    local_198._M_local_buf[0] = '\0';
    local_1d0 = local_188;
    pCVar12 = local_248;
    local_1f0 = local_1a8;
    paVar26 = &local_198;
    if ((local_1a8 != &local_1e0) &&
       (paVar26 = local_1a8, local_1a8 = &local_198,
       operator_delete(paVar26,local_1e0._M_allocated_capacity + 1), pCVar12 = local_248,
       paVar26 = local_1a8, local_1a8 != &local_198)) {
      operator_delete(local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
      paVar26 = local_1a8;
    }
    local_1a8 = paVar26;
    local_180 = (internal *)&local_170;
    piVar16 = (internal *)(prefix + 0x10);
    if (*(internal **)prefix == piVar16) {
      local_170 = *(ulong *)piVar16;
      uStack_168 = *(undefined8 *)(prefix + 0x18);
    }
    else {
      local_170 = *(ulong *)piVar16;
      local_180 = *(internal **)prefix;
    }
    local_178 = *(long *)(prefix + 8);
    *(internal **)prefix = piVar16;
    prefix[8] = '\0';
    prefix[9] = '\0';
    prefix[10] = '\0';
    prefix[0xb] = '\0';
    prefix[0xc] = '\0';
    prefix[0xd] = '\0';
    prefix[0xe] = '\0';
    prefix[0xf] = '\0';
    prefix[0x10] = '\0';
    local_160 = *(uint *)(prefix + 0x20);
    pcVar10 = strchr((char *)pCVar12,0x2c);
    if (pcVar10 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar10 + 1);
        pcVar10 = pcVar10 + 1;
        iVar9 = isspace((uint)*pbVar1);
      } while (iVar9 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("VerifyCertificateChainSingleRootTest");
    pcVar23 = strchr(pcVar10,0x2c);
    if (pcVar23 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,pcVar10,(allocator<char> *)&local_348);
    }
    else {
      local_138 = &local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,pcVar10,pcVar23);
    }
    local_b0._M_dataplus._M_p = (pointer)local_138;
    if (local_130 != 0) {
      pcVar23 = local_138->_M_local_buf + local_130;
      do {
        paVar26 = local_138;
        iVar9 = isspace((uint)(byte)pcVar23[-1]);
        local_b0._M_dataplus._M_p = (pointer)paVar26;
        if (iVar9 == 0) break;
        pcVar24 = pcVar23 + -1;
        uVar21 = (long)pcVar24 - (long)paVar26;
        std::__cxx11::string::_M_erase((ulong)&local_138,uVar21);
        pcVar23 = local_138->_M_local_buf + uVar21;
        local_b0._M_dataplus._M_p = (pointer)local_138;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar24 != paVar26);
    }
    local_138 = &local_128;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == local_138) {
      local_b0.field_2._8_8_ = local_128._8_8_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    local_b0.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
    local_b0.field_2._M_local_buf[0] = local_128._M_local_buf[0];
    local_b0._M_string_length = local_130;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                     *)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ +
                       8),&local_b0);
    iVar9 = 0x6e1c18;
    if (cVar11._M_node ==
        (_Base_ptr)
        (bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 0x10))
    goto LAB_0039f197;
    pCVar12 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_,
                         &local_b0);
    local_240 = &local_230;
    pcVar2 = (pCVar12->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,pcVar2,pcVar2 + (pCVar12->file)._M_string_length);
    local_220 = pCVar12->line;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    local_320.field_2._M_allocated_capacity._0_7_ = 0x69754268746150;
    local_320.field_2._7_4_ = 0x7265646c;
    local_320._M_string_length = 0xb;
    local_320.field_2._M_local_buf[0xb] = '\0';
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_320);
    local_290 = &local_280;
    piVar16 = (internal *)(plVar13 + 2);
    if ((internal *)*plVar13 == piVar16) {
      lVar3 = *(long *)piVar16;
      lVar4 = plVar13[3];
      local_280 = SUB81(lVar3,0);
      uStack_27f = (undefined6)((ulong)lVar3 >> 8);
      uStack_279._0_1_ = (undefined1)((ulong)lVar3 >> 0x38);
      uStack_279._1_3_ = (undefined3)lVar4;
      uStack_275 = (undefined1)((ulong)lVar4 >> 0x18);
      uStack_274 = (undefined4)((ulong)lVar4 >> 0x20);
    }
    else {
      lVar3 = *(long *)piVar16;
      local_280 = SUB81(lVar3,0);
      uStack_27f = (undefined6)((ulong)lVar3 >> 8);
      uStack_279._0_1_ = (undefined1)((ulong)lVar3 >> 0x38);
      local_290 = (internal *)*plVar13;
    }
    local_288 = plVar13[1];
    *plVar13 = (long)piVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_300 = (internal *)&local_2f0;
    piVar16 = (internal *)(plVar13 + 2);
    if ((internal *)*plVar13 == piVar16) {
      local_2f0 = *(long *)piVar16;
      lStack_2e8 = plVar13[3];
    }
    else {
      local_2f0 = *(long *)piVar16;
      local_300 = (internal *)*plVar13;
    }
    local_2f8 = plVar13[1];
    *plVar13 = (long)piVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_2d8 = &local_2c8;
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar26) {
      local_2c8._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_2c8._8_8_ = plVar13[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13;
    }
    local_2d0 = plVar13[1];
    *plVar13 = (long)paVar26;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_2d8,**(ulong **)local_1f8);
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    puVar17 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_390.field_2._M_allocated_capacity = *puVar17;
      local_390.field_2._8_8_ = plVar13[3];
    }
    else {
      local_390.field_2._M_allocated_capacity = *puVar17;
      local_390._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_390._M_string_length = plVar13[1];
    *plVar13 = (long)puVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    pcVar23 = strchr(pcVar10,0x2c);
    if (pcVar23 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,pcVar10,(allocator<char> *)&local_2b0);
      ptVar20 = extraout_RDX_04;
    }
    else {
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,pcVar10,pcVar23);
      ptVar20 = extraout_RDX_03;
    }
    _Var27._M_p = local_368._M_dataplus._M_p;
    if (local_368._M_string_length != 0) {
      pcVar23 = local_368._M_dataplus._M_p + local_368._M_string_length;
      do {
        _Var6._M_p = local_368._M_dataplus._M_p;
        iVar9 = isspace((uint)(byte)pcVar23[-1]);
        ptVar20 = extraout_RDX_05;
        _Var27._M_p = _Var6._M_p;
        if (iVar9 == 0) break;
        pcVar24 = pcVar23 + -1;
        uVar21 = (long)pcVar24 - (long)_Var6._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_368,uVar21);
        pcVar23 = local_368._M_dataplus._M_p + uVar21;
        ptVar20 = extraout_RDX_06;
        _Var27._M_p = local_368._M_dataplus._M_p;
      } while (pcVar24 != _Var6._M_p);
    }
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    if (_Var27._M_p == local_368._M_dataplus._M_p) {
      local_3a8._8_8_ =
           CONCAT44(local_368.field_2._12_4_,
                    CONCAT13(local_368.field_2._M_local_buf[0xb],local_368.field_2._8_3_));
      _Var27._M_p = (pointer)&local_3a8;
    }
    local_3a8._M_allocated_capacity._1_6_ = local_368.field_2._M_allocated_capacity._1_6_;
    local_3a8._M_local_buf[0] = local_368.field_2._M_local_buf[0];
    local_3a8._M_local_buf[7] = local_368.field_2._M_local_buf[7];
    local_3b0 = local_368._M_string_length;
    local_368._M_string_length = 0;
    local_368.field_2._M_local_buf[0] = '\0';
    local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var27._M_p;
    GetTypeName_abi_cxx11_
              (&local_2b0,
               (internal *)&bssl::(anonymous_namespace)::PathBuilderTestDelegate::typeinfo,ptVar20);
    _Var6._M_p = local_2b0._M_dataplus._M_p;
    local_348.file._M_dataplus._M_p = (pointer)&local_348.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_240,local_238 + (long)local_240);
    iVar9 = local_220;
    paVar26 = local_240;
    local_348.line = local_220;
    bVar8 = IsTrue(true);
    if (!bVar8) {
      GTestLog::GTestLog((GTestLog *)&local_268,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar26 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar14 = strlen(paVar26->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar26->_M_local_buf,sVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar9);
      GTestLog::~GTestLog((GTestLog *)&local_268);
    }
    iVar9 = local_220;
    paVar26 = local_240;
    bVar8 = IsTrue(true);
    if (!bVar8) {
      GTestLog::GTestLog((GTestLog *)&local_268,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar26 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
      }
      else {
        sVar14 = strlen(paVar26->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar26->_M_local_buf,sVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar9);
      GTestLog::~GTestLog((GTestLog *)&local_268);
    }
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006c4310;
    MakeAndRegisterTestInfo
              (&local_390,_Var27._M_p,_Var6._M_p,(char *)0x0,&local_348,
               &TypeIdHelper<bssl::VerifyCertificateChainSingleRootTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.file._M_dataplus._M_p != &local_348.file.field_2) {
      operator_delete(local_348.file._M_dataplus._M_p,
                      local_348.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,local_3a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,
                      CONCAT17(local_368.field_2._M_local_buf[7],
                               CONCAT61(local_368.field_2._M_allocated_capacity._1_6_,
                                        local_368.field_2._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
    }
    if (local_300 != (internal *)&local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,CONCAT17((undefined1)uStack_279,CONCAT61(uStack_27f,local_280)) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      CONCAT17(local_320.field_2._M_local_buf[7],
                               local_320.field_2._M_allocated_capacity._0_7_) + 1);
    }
    uVar5 = local_230._M_allocated_capacity;
    if (local_240 == &local_230) {
      local_1e0._8_8_ = local_230._8_8_;
      local_240 = &local_1e0;
    }
    local_1e0._M_allocated_capacity = local_230._M_allocated_capacity;
    local_1e8 = local_238;
    local_238 = 0;
    local_230._M_allocated_capacity = local_230._M_allocated_capacity & 0xffffffffffffff00;
    local_1d0 = local_220;
    paVar26 = &local_230;
    local_1f0 = local_240;
    if ((local_240 != &local_1e0) &&
       (local_240 = &local_230, operator_delete(local_1f0,uVar5 + 1), paVar26 = local_240,
       local_240 != &local_230)) {
      operator_delete(local_240,local_230._M_allocated_capacity + 1);
      paVar26 = local_240;
    }
    local_240 = paVar26;
    uVar7 = uStack_279;
    local_290 = &local_280;
    local_280 = SUB81(local_170,0);
    uStack_279._0_1_ = (undefined1)(local_170 >> 0x38);
    uStack_27f = (undefined6)(local_170 >> 8);
    if (local_180 == (internal *)&local_170) {
      uStack_279._1_3_ = (undefined3)uStack_168;
      uStack_275 = (undefined1)((ulong)uStack_168 >> 0x18);
      uStack_274 = (undefined4)((ulong)uStack_168 >> 0x20);
    }
    else {
      local_290 = local_180;
      uStack_279._1_3_ = SUB43(uVar7,1);
    }
    local_288 = local_178;
    local_178 = 0;
    local_170 = local_170 & 0xffffffffffffff00;
    local_270 = local_160;
    local_180 = (internal *)&local_170;
    pcVar10 = strchr(pcVar10,0x2c);
    if (pcVar10 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar10 + 1);
        pcVar10 = pcVar10 + 1;
        iVar9 = isspace((uint)*pbVar1);
      } while (iVar9 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("VerifyCertificateChainSingleRootTest");
    pcVar23 = strchr(pcVar10,0x2c);
    if (pcVar23 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,pcVar10,(allocator<char> *)&local_348);
    }
    else {
      local_118 = (CodeLocation *)local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar10,pcVar23);
    }
    local_90._0_8_ = local_118;
    if (local_110 != 0) {
      pcVar23 = (char *)((long)&(local_118->file)._M_dataplus._M_p + local_110);
      do {
        pCVar12 = local_118;
        iVar9 = isspace((uint)(byte)pcVar23[-1]);
        local_90._0_8_ = pCVar12;
        if (iVar9 == 0) break;
        pCVar25 = (CodeLocation *)(pcVar23 + -1);
        uVar21 = (long)pCVar25 - (long)pCVar12;
        std::__cxx11::string::_M_erase((ulong)&local_118,uVar21);
        pcVar23 = (char *)(uVar21 + (long)local_118);
        local_90._0_8_ = local_118;
      } while (pCVar25 != pCVar12);
    }
    local_248 = (CodeLocation *)(local_90 + 0x10);
    local_118 = (CodeLocation *)local_108;
    if ((CodeLocation *)local_90._0_8_ == local_118) {
      uStack_78 = local_108._8_8_;
      local_90._0_8_ = local_248;
    }
    uStack_7f = local_108._1_7_;
    local_90[0x10] = local_108[0];
    local_90._8_8_ = local_110;
    local_110 = 0;
    local_108[0] = 0;
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                     *)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ +
                       8),(key_type *)local_90);
    iVar9 = 0x6e1c18;
    if (cVar11._M_node !=
        (_Base_ptr)
        (bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 0x10)) {
      pCVar12 = TypedTestSuitePState::GetCodeLocation
                          ((TypedTestSuitePState *)
                           bssl::
                           gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_,
                           (string *)local_90);
      local_2d8 = &local_2c8;
      pcVar2 = (pCVar12->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,pcVar2,pcVar2 + (pCVar12->file)._M_string_length);
      local_2b8 = pCVar12->line;
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      local_368.field_2._M_local_buf[0] = 'P';
      local_368.field_2._M_allocated_capacity._1_6_ = 0x697542687461;
      local_368.field_2._7_4_ = 0x7265646c;
      local_368._M_string_length = 0xb;
      local_368.field_2._M_local_buf[0xb] = '\0';
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_368);
      local_3b8 = &local_3a8;
      puVar17 = (ulong *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_3a8._M_allocated_capacity = *puVar17;
        local_3a8._8_8_ = plVar13[3];
      }
      else {
        local_3a8._M_allocated_capacity = *puVar17;
        local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar13;
      }
      local_3b0 = plVar13[1];
      *plVar13 = (long)puVar17;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_3b8);
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      plVar18 = plVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar18) {
        lVar3 = plVar13[3];
        local_320.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar18;
        local_320.field_2._M_local_buf[7] = (char)((ulong)*plVar18 >> 0x38);
        local_320.field_2._8_3_ = (undefined3)lVar3;
        local_320.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
        local_320.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      }
      else {
        local_320.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar18;
        local_320.field_2._M_local_buf[7] = (char)((ulong)*plVar18 >> 0x38);
        local_320._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_320._M_string_length = plVar13[1];
      *plVar13 = (long)plVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_320);
      local_300 = (internal *)&local_2f0;
      piVar16 = (internal *)(plVar13 + 2);
      if ((internal *)*plVar13 == piVar16) {
        local_2f0 = *(long *)piVar16;
        lStack_2e8 = plVar13[3];
      }
      else {
        local_2f0 = *(long *)piVar16;
        local_300 = (internal *)*plVar13;
      }
      local_2f8 = plVar13[1];
      *plVar13 = (long)piVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_300,**(ulong **)local_1f8);
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      puVar17 = (ulong *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_390.field_2._M_allocated_capacity = *puVar17;
        local_390.field_2._8_8_ = plVar13[3];
      }
      else {
        local_390.field_2._M_allocated_capacity = *puVar17;
        local_390._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_390._M_string_length = plVar13[1];
      *plVar13 = (long)puVar17;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      pcVar23 = strchr(pcVar10,0x2c);
      if (pcVar23 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,pcVar10,(allocator<char> *)&local_1c8);
        ptVar20 = extraout_RDX_08;
      }
      else {
        local_268 = &local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,pcVar10,pcVar23);
        ptVar20 = extraout_RDX_07;
      }
      paVar26 = local_268;
      if (local_260 != 0) {
        pcVar23 = local_268->_M_local_buf + local_260;
        do {
          paVar22 = local_268;
          iVar9 = isspace((uint)(byte)pcVar23[-1]);
          ptVar20 = extraout_RDX_09;
          paVar26 = paVar22;
          if (iVar9 == 0) break;
          pcVar24 = pcVar23 + -1;
          uVar21 = (long)pcVar24 - (long)paVar22;
          std::__cxx11::string::_M_erase((ulong)&local_268,uVar21);
          pcVar23 = local_268->_M_local_buf + uVar21;
          ptVar20 = extraout_RDX_10;
          paVar26 = local_268;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar24 != paVar22);
      }
      local_268 = &local_258;
      if (paVar26 == local_268) {
        local_2b0.field_2._8_8_ =
             CONCAT44(local_258._12_4_,CONCAT13(local_258._M_local_buf[0xb],local_258._8_3_));
        paVar26 = &local_2b0.field_2;
      }
      local_2b0.field_2._M_allocated_capacity._1_6_ = local_258._M_allocated_capacity._1_6_;
      local_2b0.field_2._M_local_buf[0] = local_258._M_local_buf[0];
      local_2b0.field_2._M_local_buf[7] = local_258._M_local_buf[7];
      local_2b0._M_string_length = local_260;
      local_260 = 0;
      local_258._M_local_buf[0] = '\0';
      local_2b0._M_dataplus._M_p = (pointer)paVar26;
      GetTypeName_abi_cxx11_
                (&local_1c8,
                 (internal *)&bssl::(anonymous_namespace)::PathBuilderTestDelegate::typeinfo,ptVar20
                );
      _Var27._M_p = local_1c8._M_dataplus._M_p;
      local_348.file._M_dataplus._M_p = (pointer)&local_348.file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,local_2d8,local_2d0 + (long)local_2d8);
      iVar9 = local_2b8;
      paVar22 = local_2d8;
      local_348.line = local_2b8;
      bVar8 = IsTrue(true);
      if (!bVar8) {
        GTestLog::GTestLog((GTestLog *)&local_218,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x201);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                   ,0x6a);
        if (paVar22 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
        }
        else {
          sVar14 = strlen(paVar22->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar22->_M_local_buf,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar9);
        GTestLog::~GTestLog((GTestLog *)&local_218);
      }
      iVar9 = local_2b8;
      paVar22 = local_2d8;
      bVar8 = IsTrue(true);
      if (!bVar8) {
        GTestLog::GTestLog((GTestLog *)&local_218,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x216);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                   ,0x6f);
        if (paVar22 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
        }
        else {
          sVar14 = strlen(paVar22->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar22->_M_local_buf,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar9);
        GTestLog::~GTestLog((GTestLog *)&local_218);
      }
      pTVar15 = (TestFactoryBase *)operator_new(8);
      pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006c43a8;
      MakeAndRegisterTestInfo
                (&local_390,paVar26->_M_local_buf,_Var27._M_p,(char *)0x0,&local_348,
                 &TypeIdHelper<bssl::VerifyCertificateChainSingleRootTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>>
                  ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348.file._M_dataplus._M_p != &local_348.file.field_2) {
        operator_delete(local_348.file._M_dataplus._M_p,
                        local_348.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,
                        CONCAT17(local_258._M_local_buf[7],
                                 CONCAT61(local_258._M_allocated_capacity._1_6_,
                                          local_258._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if (local_300 != (internal *)&local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT17(local_320.field_2._M_local_buf[7],
                                 local_320.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8,local_3a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,
                        CONCAT17(local_368.field_2._M_local_buf[7],
                                 CONCAT61(local_368.field_2._M_allocated_capacity._1_6_,
                                          local_368.field_2._M_local_buf[0])) + 1);
      }
      uVar5 = local_2c8._M_allocated_capacity;
      if (local_2d8 == &local_2c8) {
        local_1e0._8_8_ = local_2c8._8_8_;
        local_2d8 = &local_1e0;
      }
      local_1e0._M_allocated_capacity = local_2c8._M_allocated_capacity;
      local_1e8 = local_2d0;
      local_2d0 = 0;
      local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
      local_1d0 = local_2b8;
      paVar26 = &local_2c8;
      local_1f0 = local_2d8;
      if ((local_2d8 != &local_1e0) &&
         (local_2d8 = &local_2c8, operator_delete(local_1f0,uVar5 + 1), paVar26 = local_2d8,
         local_2d8 != &local_2c8)) {
        operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
        paVar26 = local_2d8;
      }
      local_2d8 = paVar26;
      local_300 = (internal *)&local_2f0;
      if (local_290 == &local_280) {
        lStack_2e8 = CONCAT44(uStack_274,CONCAT13(uStack_275,uStack_279._1_3_));
      }
      else {
        local_300 = local_290;
      }
      local_2f0 = CONCAT17((undefined1)uStack_279,CONCAT61(uStack_27f,local_280));
      local_2f8 = local_288;
      local_288 = 0;
      local_280 = (internal)0x0;
      local_2e0 = local_270;
      local_290 = &local_280;
      pcVar10 = strchr(pcVar10,0x2c);
      if (pcVar10 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        do {
          pbVar1 = (byte *)(pcVar10 + 1);
          pcVar10 = pcVar10 + 1;
          iVar9 = isspace((uint)*pbVar1);
        } while (iVar9 != 0);
      }
      RegisterTypeParameterizedTestSuiteInstantiation("VerifyCertificateChainSingleRootTest");
      pcVar23 = strchr(pcVar10,0x2c);
      if (pcVar23 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_108 + 0x10),pcVar10,(allocator<char> *)&local_348);
      }
      else {
        local_f8._M_allocated_capacity = (size_type)(local_108 + 0x20);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_108 + 0x10),pcVar10,pcVar23);
      }
      local_70._M_allocated_capacity = local_f8._M_allocated_capacity;
      if (local_f8._8_8_ != 0) {
        pcVar23 = (char *)(local_f8._8_8_ + local_f8._M_allocated_capacity);
        do {
          uVar5 = local_f8._M_allocated_capacity;
          iVar9 = isspace((uint)(byte)pcVar23[-1]);
          local_70._M_allocated_capacity = uVar5;
          if (iVar9 == 0) break;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar23 + -1);
          uVar21 = (long)paVar26 - uVar5;
          std::__cxx11::string::_M_erase((ulong)(local_108 + 0x10),uVar21);
          pcVar23 = (char *)(uVar21 + local_f8._M_allocated_capacity);
          local_70._M_allocated_capacity = local_f8._M_allocated_capacity;
        } while (paVar26 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar5);
      }
      local_d8 = &local_60;
      local_f8._M_allocated_capacity = (size_type)(local_108 + 0x20);
      if (local_70._M_allocated_capacity == local_f8._M_allocated_capacity) {
        local_60._8_8_ = local_e8._8_8_;
        local_70._M_allocated_capacity = (size_type)local_d8;
      }
      local_60._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
      local_60._M_local_buf[0] = local_e8._M_local_buf[0];
      local_70._8_8_ = local_f8._8_8_;
      local_f8._8_8_ = 0;
      local_e8._M_local_buf[0] = 0;
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                       *)(bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_
                         + 8),(key_type *)&local_70);
      iVar9 = 0x6e1c18;
      if (cVar11._M_node !=
          (_Base_ptr)
          (bssl::gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_ + 0x10)) {
        pCVar12 = TypedTestSuitePState::GetCodeLocation
                            ((TypedTestSuitePState *)
                             bssl::
                             gtest_typed_test_suite_p_state_VerifyCertificateChainSingleRootTest_,
                             (string *)&local_70);
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        pcVar2 = (pCVar12->file)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_390,pcVar2,pcVar2 + (pCVar12->file)._M_string_length);
        local_370 = pCVar12->line;
        local_268 = &local_258;
        local_258._M_local_buf[0] = 'P';
        local_258._M_allocated_capacity._1_6_ = 0x697542687461;
        local_258._7_4_ = 0x7265646c;
        local_260 = 0xb;
        local_258._M_local_buf[0xb] = '\0';
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_268);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        psVar19 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_2b0.field_2._M_allocated_capacity = *psVar19;
          local_2b0.field_2._8_8_ = plVar13[3];
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *psVar19;
          local_2b0._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_2b0._M_string_length = plVar13[1];
        *plVar13 = (long)psVar19;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_2b0);
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        plVar18 = plVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar18) {
          lVar3 = *plVar18;
          lVar4 = plVar13[3];
          local_368.field_2._M_local_buf[0] = (char)lVar3;
          local_368.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar3 >> 8);
          local_368.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
          local_368.field_2._8_3_ = (undefined3)lVar4;
          local_368.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
          local_368.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
        }
        else {
          lVar3 = *plVar18;
          local_368.field_2._M_local_buf[0] = (char)lVar3;
          local_368.field_2._M_allocated_capacity._1_6_ = (undefined6)((ulong)lVar3 >> 8);
          local_368.field_2._M_local_buf[7] = (char)((ulong)lVar3 >> 0x38);
          local_368._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_368._M_string_length = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_368);
        local_3b8 = &local_3a8;
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 == paVar26) {
          local_3a8._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_3a8._8_8_ = plVar13[3];
        }
        else {
          local_3a8._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_3b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13;
        }
        local_3b0 = plVar13[1];
        *plVar13 = (long)paVar26;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_3b8,**(ulong **)local_1f8);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        plVar18 = plVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar18) {
          lVar3 = plVar13[3];
          local_320.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar18;
          local_320.field_2._M_local_buf[7] = (char)((ulong)*plVar18 >> 0x38);
          local_320.field_2._8_3_ = (undefined3)lVar3;
          local_320.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
          local_320.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
        }
        else {
          local_320.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar18;
          local_320.field_2._M_local_buf[7] = (char)((ulong)*plVar18 >> 0x38);
          local_320._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_320._M_string_length = plVar13[1];
        *plVar13 = (long)plVar18;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        pcVar23 = strchr(pcVar10,0x2c);
        if (pcVar23 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218,pcVar10,(allocator<char> *)&local_50);
          ptVar20 = extraout_RDX_12;
        }
        else {
          local_218 = &local_208;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pcVar10,pcVar23);
          ptVar20 = extraout_RDX_11;
        }
        paVar26 = local_218;
        if (local_210 != 0) {
          pcVar10 = local_218->_M_local_buf + local_210;
          do {
            paVar22 = local_218;
            iVar9 = isspace((uint)(byte)pcVar10[-1]);
            ptVar20 = extraout_RDX_13;
            paVar26 = paVar22;
            if (iVar9 == 0) break;
            pcVar23 = pcVar10 + -1;
            uVar21 = (long)pcVar23 - (long)paVar22;
            std::__cxx11::string::_M_erase((ulong)&local_218,uVar21);
            pcVar10 = local_218->_M_local_buf + uVar21;
            ptVar20 = extraout_RDX_14;
            paVar26 = local_218;
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar23 != paVar22);
        }
        if (paVar26 == &local_208) {
          local_1c8.field_2._8_8_ = local_208._8_8_;
          paVar26 = &local_1c8.field_2;
        }
        local_1c8.field_2._M_allocated_capacity._1_7_ = local_208._M_allocated_capacity._1_7_;
        local_1c8.field_2._M_local_buf[0] = local_208._M_local_buf[0];
        local_1c8._M_string_length = local_210;
        local_210 = 0;
        local_208._M_local_buf[0] = '\0';
        local_218 = &local_208;
        local_1c8._M_dataplus._M_p = (pointer)paVar26;
        GetTypeName_abi_cxx11_
                  (&local_50,
                   (internal *)&bssl::(anonymous_namespace)::PathBuilderTestDelegate::typeinfo,
                   ptVar20);
        _Var6._M_p = local_50._M_dataplus._M_p;
        local_348.file._M_dataplus._M_p = (pointer)&local_348.file.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_348,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        iVar9 = local_370;
        _Var27._M_p = local_390._M_dataplus._M_p;
        local_348.line = local_370;
        bVar8 = IsTrue(true);
        if (!bVar8) {
          GTestLog::GTestLog(&local_394,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                     ,0x6a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var27._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
          }
          else {
            sVar14 = strlen(_Var27._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var27._M_p,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar9);
          GTestLog::~GTestLog(&local_394);
        }
        iVar9 = local_370;
        _Var27._M_p = local_390._M_dataplus._M_p;
        bVar8 = IsTrue(true);
        if (!bVar8) {
          GTestLog::GTestLog(&local_394,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                     ,0x6f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var27._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6e5750);
          }
          else {
            sVar14 = strlen(_Var27._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var27._M_p,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar9);
          GTestLog::~GTestLog(&local_394);
        }
        pTVar15 = (TestFactoryBase *)operator_new(8);
        pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006c4440;
        MakeAndRegisterTestInfo
                  (&local_320,paVar26->_M_local_buf,_Var6._M_p,(char *)0x0,&local_348,
                   &TypeIdHelper<bssl::VerifyCertificateChainSingleRootTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>>
                    ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348.file._M_dataplus._M_p != &local_348.file.field_2) {
          operator_delete(local_348.file._M_dataplus._M_p,
                          local_348.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (local_218 != &local_208) {
          operator_delete(local_218,
                          CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,
                          CONCAT17(local_320.field_2._M_local_buf[7],
                                   local_320.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if (local_3b8 != &local_3a8) {
          operator_delete(local_3b8,local_3a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p,
                          CONCAT17(local_368.field_2._M_local_buf[7],
                                   CONCAT61(local_368.field_2._M_allocated_capacity._1_6_,
                                            local_368.field_2._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268,
                          CONCAT17(local_258._M_local_buf[7],
                                   CONCAT61(local_258._M_allocated_capacity._1_6_,
                                            local_258._M_local_buf[0])) + 1);
        }
        uVar5 = local_390.field_2._M_allocated_capacity;
        paVar26 = &local_390.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p == paVar26) {
          local_1e0._8_8_ = local_390.field_2._8_8_;
          local_390._M_dataplus._M_p = (pointer)&local_1e0;
        }
        local_1e0._M_allocated_capacity = local_390.field_2._M_allocated_capacity;
        local_1e8 = local_390._M_string_length;
        local_390._M_string_length = 0;
        local_390.field_2._M_allocated_capacity =
             local_390.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1d0 = local_370;
        _Var27._M_p = (pointer)paVar26;
        local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_390._M_dataplus._M_p;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_390._M_dataplus._M_p != &local_1e0) &&
           (local_390._M_dataplus._M_p = (pointer)paVar26, operator_delete(local_1f0,uVar5 + 1),
           _Var27._M_p = local_390._M_dataplus._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_390._M_dataplus._M_p != paVar26)) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          _Var27._M_p = local_390._M_dataplus._M_p;
        }
        local_390._M_dataplus._M_p = _Var27._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_allocated_capacity != &local_60) {
          operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1)
          ;
        }
        if (local_300 != (internal *)&local_2f0) {
          operator_delete(local_300,local_2f0 + 1);
        }
        if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,stack0xffffffffffffff80 + 1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,
                          CONCAT17((undefined1)uStack_279,CONCAT61(uStack_27f,local_280)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_180 != (internal *)&local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        paVar26 = &local_d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar26) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          paVar26 = extraout_RAX;
        }
        return SUB81(paVar26,0);
      }
      goto LAB_0039f219;
    }
  }
  FormatFileLocation_abi_cxx11_(&local_348.file,local_290,(char *)(ulong)local_270,iVar9);
  TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderTestDelegate>>
  ::Register();
LAB_0039f219:
  FormatFileLocation_abi_cxx11_(&local_348.file,local_300,(char *)(ulong)local_2e0,iVar9);
  TypeParameterizedTestSuite<bssl::VerifyCertificateChainSingleRootTest,testing::internal::Templates<bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::Policies,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::ManyNames,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetOnly,bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::TargetSelfSigned>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderTestDelegate>>
  ::Register();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,local_d8->_M_allocated_capacity + 1);
  }
  if (local_300 != (internal *)&local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,(ulong)((local_248->file)._M_dataplus._M_p + 1));
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,CONCAT17((undefined1)uStack_279,CONCAT61(uStack_27f,local_280)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_180 != (internal *)&local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }